

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConcurrentPtrQueue.hpp
# Opt level: O2

bool __thiscall
sftm::CConcurrentPtrQueue<sftm::CAsyncTask>::Push
          (CConcurrentPtrQueue<sftm::CAsyncTask> *this,CAsyncTask *pItem)

{
  uint uVar1;
  
  CSpinLock::lock(&this->m_lock);
  uVar1 = this->m_nCount;
  if ((ulong)uVar1 < 0x200) {
    this->m_nCount = uVar1 + 1;
    this->m_pItems[uVar1] = pItem;
  }
  (this->m_lock).m_bLock._M_base._M_i = false;
  return uVar1 < 0x200;
}

Assistant:

bool Push(T* pItem) noexcept
		{
			std::lock_guard<CSyncPrimitive> lock(m_lock);

			if (m_nCount >= QUEUE_PHYSICAL_SIZE)
				return false;

			m_pItems[m_nCount++] = pItem;

			return true;
		}